

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O0

int encode_write(char *data,int len)

{
  int iVar1;
  int ret;
  int encode_len;
  uchar buf [128];
  int len_local;
  char *data_local;
  
  ret._0_1_ = 9;
  iVar1 = encode((uchar *)data,len,(uchar *)((long)&ret + 1),0x7e);
  *(undefined1 *)((long)&ret + (long)(iVar1 + 1)) = 10;
  iVar1 = serial_write((char *)&ret,iVar1 + 2);
  if (iVar1 < 1) {
    data_local._4_4_ = -1;
  }
  else {
    serial_flush_out();
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

int encode_write(char* data, int len)
{
  unsigned char buf[128];
  int encode_len, ret;

  buf[0] = COMMUNICATION_START_BYTE;
  encode_len = encode((unsigned char*)data, len, buf + 1, 126);
  buf[encode_len + 1] = COMMUNICATION_END_BYTE;

  ret = serial_write((char*)buf, encode_len + 2);
  if (ret <= 0)
  {
    return -1;
  }
  serial_flush_out();

  return 0;
}